

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O1

int __thiscall
DIS::ElectromagneticEmissionBeamData::getMarshalledSize(ElectromagneticEmissionBeamData *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pTVar4;
  ulong uVar5;
  long lVar6;
  TrackJamData listElement;
  TrackJamData local_60;
  
  iVar1 = EEFundamentalParameterData::getMarshalledSize(&this->_fundamentalParameterData);
  iVar2 = BeamData::getMarshalledSize(&this->_beamData);
  iVar3 = JammingTechnique::getMarshalledSize(&this->_jammingTechnique);
  iVar1 = iVar3 + iVar2 + iVar1 + 8;
  pTVar4 = (this->_trackJamTargets).
           super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_trackJamTargets).
      super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar4) {
    lVar6 = 0x28;
    uVar5 = 0;
    do {
      local_60._vptr_TrackJamData = (_func_int **)&PTR__TrackJamData_001b6470;
      local_60._entityID._vptr_EntityID = (_func_int **)&PTR__EntityID_001b45b0;
      local_60._entityID._simulationAddress._vptr_SimulationAddress =
           (_func_int **)&PTR__SimulationAddress_001b5fb8;
      local_60._entityID._simulationAddress._8_4_ = *(undefined4 *)((long)pTVar4 + lVar6 + -0x10);
      local_60._entityID._entityNumber = *(unsigned_short *)((long)pTVar4 + lVar6 + -8);
      local_60._40_2_ = *(undefined2 *)((long)&pTVar4->_vptr_TrackJamData + lVar6);
      iVar2 = TrackJamData::getMarshalledSize(&local_60);
      iVar1 = iVar1 + iVar2;
      TrackJamData::~TrackJamData(&local_60);
      uVar5 = uVar5 + 1;
      pTVar4 = (this->_trackJamTargets).
               super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x30;
    } while (uVar5 < (ulong)(((long)(this->_trackJamTargets).
                                    super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 4)
                            * -0x5555555555555555));
  }
  return iVar1;
}

Assistant:

int ElectromagneticEmissionBeamData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _beamDataLength
   marshalSize = marshalSize + 1;  // _beamIDNumber
   marshalSize = marshalSize + 2;  // _beamParameterIndex
   marshalSize = marshalSize + _fundamentalParameterData.getMarshalledSize();  // _fundamentalParameterData
   marshalSize = marshalSize + _beamData.getMarshalledSize();  // _beamData
   marshalSize = marshalSize + 1;  // _beamFunction
   marshalSize = marshalSize + 1;  // _numberOfTrackJamTargets
   marshalSize = marshalSize + 1;  // _highDensityTrackJam
   marshalSize = marshalSize + 1;  // _beamStatus
   marshalSize = marshalSize + _jammingTechnique.getMarshalledSize();  // _jammingTechnique

   for(unsigned long long idx=0; idx < _trackJamTargets.size(); idx++)
   {
        TrackJamData listElement = _trackJamTargets[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}